

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O0

int fits_clear_Fptr(FITSfile *Fptr,int *status)

{
  int ii;
  int *status_local;
  FITSfile *Fptr_local;
  
  ii = 0;
  do {
    if (9999 < ii) {
LAB_00112f18:
      return *status;
    }
    if (FptrTable[ii] == Fptr) {
      FptrTable[ii] = (FITSfile *)0x0;
      goto LAB_00112f18;
    }
    ii = ii + 1;
  } while( true );
}

Assistant:

int fits_clear_Fptr(FITSfile *Fptr,  /* O - FITS file pointer               */ 
           int *status)              /* IO - error status                   */
/*
   clear the Fptr address from the Fptr Table  
*/
{
    int ii;

    FFLOCK;
    for (ii = 0; ii < NMAXFILES; ii++) {
        if (FptrTable[ii] == Fptr) {
            FptrTable[ii] = 0;
            break;
        }
    }
    FFUNLOCK;
    return(*status);
}